

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressLiterals
                 (void *dst,size_t dstCapacity,void *src,size_t srcSize,void *entropyWorkspace,
                 size_t entropyWorkspaceSize,ZSTD_hufCTables_t *prevHuf,ZSTD_hufCTables_t *nextHuf,
                 ZSTD_strategy strategy,int disableLiteralCompression,int suspectUncompressible,
                 int bmi2)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  code *pcVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  long in_RDI;
  undefined8 in_R8;
  void *in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  uint in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  U32 lhc_2;
  U32 lhc_1;
  U32 lhc;
  size_t minGain;
  huf_compress_f huf_compress;
  int flags;
  HUF_repeat repeat;
  size_t cLitSize;
  symbolEncodingType_e hType;
  U32 singleStream;
  BYTE *ostart;
  size_t lhSize;
  size_t in_stack_ffffffffffffff30;
  void *srcSize_00;
  void *in_stack_ffffffffffffff38;
  void *src_00;
  size_t in_stack_ffffffffffffff40;
  int *src_01;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  void *in_stack_ffffffffffffff50;
  int local_74;
  ulong local_70;
  int local_68;
  uint local_64;
  long local_60;
  long local_58;
  void *local_50;
  ZSTD_strategy ZStack_44;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  size_t local_20;
  
  ZStack_44 = (ZSTD_strategy)((ulong)in_R8 >> 0x20);
  local_58 = (long)(int)((0x3ff < in_RCX) + 3 + (uint)(0x3fff < in_RCX));
  local_64 = (uint)(in_RCX < 0x100);
  local_68 = 2;
  local_60 = in_RDI;
  local_50 = in_R9;
  local_40 = in_RCX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  memcpy(in_stack_00000010,in_stack_00000008,0x810);
  uVar1 = local_40;
  if (in_stack_00000020 == 0) {
    sVar3 = ZSTD_minLiteralsToCompress
                      ((ZSTD_strategy)(in_stack_ffffffffffffff40 >> 0x20),
                       (HUF_repeat)in_stack_ffffffffffffff40);
    if (uVar1 < sVar3) {
      local_20 = ZSTD_noCompressLiterals
                           ((void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                            in_stack_ffffffffffffff30);
    }
    else if (local_30 < local_58 + 1U) {
      local_20 = 0xffffffffffffffba;
    }
    else {
      local_74 = *(int *)((long)in_stack_00000008 + 0x808);
      uVar5 = 0;
      if (in_stack_00000018 < 4 && local_40 < 0x401) {
        uVar5 = 4;
      }
      uVar6 = 0;
      if (7 < in_stack_00000018) {
        uVar6 = 2;
      }
      uVar7 = 0;
      if (in_stack_00000028 != 0) {
        uVar7 = 8;
      }
      uVar7 = in_stack_00000030 != 0 | uVar5 | uVar6 | uVar7;
      if ((local_74 == 2) && (local_58 == 3)) {
        local_64 = 1;
      }
      pcVar4 = HUF_compress4X_repeat;
      if (local_64 != 0) {
        pcVar4 = HUF_compress1X_repeat;
      }
      src_01 = &local_74;
      src_00 = in_stack_00000010;
      local_70 = (*pcVar4)(local_60 + local_58,local_30 - local_58,local_38,local_40,0xff,0xb);
      if (local_74 != 0) {
        local_68 = 3;
      }
      sVar3 = ZSTD_minGain((size_t)local_50,ZStack_44);
      srcSize_00 = local_50;
      if (((local_70 == 0) || (local_40 - sVar3 <= local_70)) ||
         (uVar5 = ERR_isError(local_70), srcSize_00 = local_50, uVar5 != 0)) {
        memcpy(in_stack_00000010,in_stack_00000008,0x810);
        local_20 = ZSTD_noCompressLiterals
                             ((void *)CONCAT44(in_stack_ffffffffffffff4c,uVar7),(size_t)src_01,
                              src_00,(size_t)srcSize_00);
      }
      else if ((local_70 == 1) &&
              ((7 < local_40 || (iVar2 = allBytesIdentical(src_00,(size_t)local_50), iVar2 != 0))))
      {
        memcpy(in_stack_00000010,in_stack_00000008,0x810);
        local_20 = ZSTD_compressRleLiteralsBlock
                             (in_stack_ffffffffffffff50,CONCAT44(in_stack_ffffffffffffff4c,uVar7),
                              src_01,(size_t)src_00);
      }
      else {
        if (local_68 == 2) {
          *(undefined4 *)((long)in_stack_00000010 + 0x808) = 1;
        }
        if (local_58 == 3) {
          if ((local_64 == 0) && (local_40 < 6)) {
            __assert_fail("srcSize >= MIN_LITERALS_FOR_4_STREAMS",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4acb,
                          "size_t ZSTD_compressLiterals(void *, size_t, const void *, size_t, void *, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_strategy, int, int, int)"
                         );
          }
          MEM_writeLE24(local_50,ZStack_44);
        }
        else if (local_58 == 4) {
          if (local_40 < 6) {
            __assert_fail("srcSize >= MIN_LITERALS_FOR_4_STREAMS",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4ad1,
                          "size_t ZSTD_compressLiterals(void *, size_t, const void *, size_t, void *, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_strategy, int, int, int)"
                         );
          }
          MEM_writeLE32(local_50,ZStack_44);
        }
        else {
          if (local_58 != 5) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4ade,
                          "size_t ZSTD_compressLiterals(void *, size_t, const void *, size_t, void *, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_strategy, int, int, int)"
                         );
          }
          if (local_40 < 6) {
            __assert_fail("srcSize >= MIN_LITERALS_FOR_4_STREAMS",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4ad7,
                          "size_t ZSTD_compressLiterals(void *, size_t, const void *, size_t, void *, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_strategy, int, int, int)"
                         );
          }
          MEM_writeLE32(local_50,ZStack_44);
          *(char *)(local_60 + 4) = (char)(local_70 >> 10);
        }
        local_20 = local_58 + local_70;
      }
    }
  }
  else {
    local_20 = ZSTD_noCompressLiterals
                         ((void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff30);
  }
  return local_20;
}

Assistant:

size_t ZSTD_compressLiterals (
                  void* dst, size_t dstCapacity,
            const void* src, size_t srcSize,
                  void* entropyWorkspace, size_t entropyWorkspaceSize,
            const ZSTD_hufCTables_t* prevHuf,
                  ZSTD_hufCTables_t* nextHuf,
                  ZSTD_strategy strategy,
                  int disableLiteralCompression,
                  int suspectUncompressible,
                  int bmi2)
{
    size_t const lhSize = 3 + (srcSize >= 1 KB) + (srcSize >= 16 KB);
    BYTE*  const ostart = (BYTE*)dst;
    U32 singleStream = srcSize < 256;
    symbolEncodingType_e hType = set_compressed;
    size_t cLitSize;

    DEBUGLOG(5,"ZSTD_compressLiterals (disableLiteralCompression=%i, srcSize=%u, dstCapacity=%zu)",
                disableLiteralCompression, (U32)srcSize, dstCapacity);

    DEBUGLOG(6, "Completed literals listing (%zu bytes)", showHexa(src, srcSize));

    /* Prepare nextEntropy assuming reusing the existing table */
    ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));

    if (disableLiteralCompression)
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    /* if too small, don't even attempt compression (speed opt) */
    if (srcSize < ZSTD_minLiteralsToCompress(strategy, prevHuf->repeatMode))
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    RETURN_ERROR_IF(dstCapacity < lhSize+1, dstSize_tooSmall, "not enough space for compression");
    {   HUF_repeat repeat = prevHuf->repeatMode;
        int const flags = 0
            | (bmi2 ? HUF_flags_bmi2 : 0)
            | (strategy < ZSTD_lazy && srcSize <= 1024 ? HUF_flags_preferRepeat : 0)
            | (strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD ? HUF_flags_optimalDepth : 0)
            | (suspectUncompressible ? HUF_flags_suspectUncompressible : 0);

        typedef size_t (*huf_compress_f)(void*, size_t, const void*, size_t, unsigned, unsigned, void*, size_t, HUF_CElt*, HUF_repeat*, int);
        huf_compress_f huf_compress;
        if (repeat == HUF_repeat_valid && lhSize == 3) singleStream = 1;
        huf_compress = singleStream ? HUF_compress1X_repeat : HUF_compress4X_repeat;
        cLitSize = huf_compress(ostart+lhSize, dstCapacity-lhSize,
                                src, srcSize,
                                HUF_SYMBOLVALUE_MAX, LitHufLog,
                                entropyWorkspace, entropyWorkspaceSize,
                                (HUF_CElt*)nextHuf->CTable,
                                &repeat, flags);
        DEBUGLOG(5, "%zu literals compressed into %zu bytes (before header)", srcSize, cLitSize);
        if (repeat != HUF_repeat_none) {
            /* reused the existing table */
            DEBUGLOG(5, "reusing statistics from previous huffman block");
            hType = set_repeat;
        }
    }

    {   size_t const minGain = ZSTD_minGain(srcSize, strategy);
        if ((cLitSize==0) || (cLitSize >= srcSize - minGain) || ERR_isError(cLitSize)) {
            ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
            return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }   }
    if (cLitSize==1) {
        /* A return value of 1 signals that the alphabet consists of a single symbol.
         * However, in some rare circumstances, it could be the compressed size (a single byte).
         * For that outcome to have a chance to happen, it's necessary that `srcSize < 8`.
         * (it's also necessary to not generate statistics).
         * Therefore, in such a case, actively check that all bytes are identical. */
        if ((srcSize >= 8) || allBytesIdentical(src, srcSize)) {
            ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
            return ZSTD_compressRleLiteralsBlock(dst, dstCapacity, src, srcSize);
    }   }

    if (hType == set_compressed) {
        /* using a newly constructed table */
        nextHuf->repeatMode = HUF_repeat_check;
    }

    /* Build header */
    switch(lhSize)
    {
    case 3: /* 2 - 2 - 10 - 10 */
        if (!singleStream) assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + ((U32)(!singleStream) << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<14);
            MEM_writeLE24(ostart, lhc);
            break;
        }
    case 4: /* 2 - 2 - 14 - 14 */
        assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + (2 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<18);
            MEM_writeLE32(ostart, lhc);
            break;
        }
    case 5: /* 2 - 2 - 18 - 18 */
        assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + (3 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<22);
            MEM_writeLE32(ostart, lhc);
            ostart[4] = (BYTE)(cLitSize >> 10);
            break;
        }
    default:  /* not possible : lhSize is {3,4,5} */
        assert(0);
    }
    DEBUGLOG(5, "Compressed literals: %u -> %u", (U32)srcSize, (U32)(lhSize+cLitSize));
    return lhSize+cLitSize;
}